

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

bool Cmd::iequals(string_view a,string_view b)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = a._M_len;
  if (sVar2 == b._M_len) {
    bVar1 = std::
            __equal4<char_const*,char_const*,Cmd::iequals(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::_lambda(unsigned_char,unsigned_char)_1_>
                      (a._M_str,a._M_str + sVar2,b._M_str,b._M_str + sVar2);
    return bVar1;
  }
  return false;
}

Assistant:

static bool iequals(std::string_view a, std::string_view b) {
		if (a.size() != b.size()) {
			return false;
		}

		return std::equal(a.begin(), a.end(), b.begin(), b.end(), [](unsigned char a, unsigned char b) {
			return tolower(a) == tolower(b);
		});
	}